

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O1

void impl_ARB1_UseProgram(MOJOSHADER_glProgram *program)

{
  GLuint GVar1;
  GLuint GVar2;
  
  if (program == (MOJOSHADER_glProgram *)0x0) {
    GVar2 = 0;
    GVar1 = 0;
  }
  else {
    GVar1 = 0;
    GVar2 = 0;
    if (program->vertex != (MOJOSHADER_glShader *)0x0) {
      GVar2 = program->vertex->handle;
    }
    if (program->fragment != (MOJOSHADER_glShader *)0x0) {
      GVar1 = program->fragment->handle;
    }
  }
  (**(code **)(ctx->profile + (ulong)(GVar2 == 0) * 8 + 0x78))(0x8620);
  (**(code **)(ctx->profile + (ulong)(GVar1 == 0) * 8 + 0x78))(0x8804);
  (*ctx->glBindProgramARB)(0x8620,GVar2);
  (*ctx->glBindProgramARB)(0x8804,GVar1);
  return;
}

Assistant:

static void impl_ARB1_UseProgram(MOJOSHADER_glProgram *program)
{
    GLuint vhandle = 0;
    GLuint phandle = 0;
    if (program != NULL)
    {
        if (program->vertex != NULL)
            vhandle = program->vertex->handle;
        if (program->fragment != NULL)
            phandle = program->fragment->handle;
    } // if

    toggle_gl_state(GL_VERTEX_PROGRAM_ARB, vhandle != 0);
    toggle_gl_state(GL_FRAGMENT_PROGRAM_ARB, phandle != 0);

    ctx->glBindProgramARB(GL_VERTEX_PROGRAM_ARB, vhandle);
    ctx->glBindProgramARB(GL_FRAGMENT_PROGRAM_ARB, phandle);
}